

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zello_log.h
# Opt level: O3

string * to_string_abi_cxx11_(string *__return_storage_ptr__,ze_structure_type_t val)

{
  char *pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (val - ZE_STRUCTURE_TYPE_DRIVER_PROPERTIES < 0x15) {
    pcVar1 = &DAT_0010b150 +
             *(int *)(&DAT_0010b150 + (ulong)(val - ZE_STRUCTURE_TYPE_DRIVER_PROPERTIES) * 4);
  }
  else {
    pcVar1 = "?";
  }
  std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,(ulong)pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string( const ze_structure_type_t val )
{
    std::string str;

    switch( val )
    {
    case ZE_STRUCTURE_TYPE_DRIVER_PROPERTIES:
        str = "DRIVER_PROPERTIES";
        break;

    case ZE_STRUCTURE_TYPE_DRIVER_IPC_PROPERTIES:
        str = "DRIVER_IPC_PROPERTIES";
        break;

    case ZE_STRUCTURE_TYPE_DEVICE_PROPERTIES:
        str = "DEVICE_PROPERTIES";
        break;

    case ZE_STRUCTURE_TYPE_DEVICE_COMPUTE_PROPERTIES:
        str = "DEVICE_COMPUTE_PROPERTIES";
        break;

    case ZE_STRUCTURE_TYPE_DEVICE_MODULE_PROPERTIES:
        str = "DEVICE_MODULE_PROPERTIES";
        break;

    case ZE_STRUCTURE_TYPE_COMMAND_QUEUE_GROUP_PROPERTIES:
        str = "COMMAND_QUEUE_GROUP_PROPERTIES";
        break;

    case ZE_STRUCTURE_TYPE_DEVICE_MEMORY_PROPERTIES:
        str = "DEVICE_MEMORY_PROPERTIES";
        break;

    case ZE_STRUCTURE_TYPE_DEVICE_MEMORY_ACCESS_PROPERTIES:
        str = "DEVICE_MEMORY_ACCESS_PROPERTIES";
        break;

    case ZE_STRUCTURE_TYPE_DEVICE_CACHE_PROPERTIES:
        str = "DEVICE_CACHE_PROPERTIES";
        break;

    case ZE_STRUCTURE_TYPE_DEVICE_IMAGE_PROPERTIES:
        str = "DEVICE_IMAGE_PROPERTIES";
        break;

    case ZE_STRUCTURE_TYPE_DEVICE_P2P_PROPERTIES:
        str = "DEVICE_P2P_PROPERTIES";
        break;

    case ZE_STRUCTURE_TYPE_DEVICE_EXTERNAL_MEMORY_PROPERTIES:
        str = "DEVICE_EXTERNAL_MEMORY_PROPERTIES";
        break;

    case ZE_STRUCTURE_TYPE_CONTEXT_DESC:
        str = "CONTEXT_DESC";
        break;

    case ZE_STRUCTURE_TYPE_COMMAND_QUEUE_DESC:
        str = "COMMAND_QUEUE_DESC";
        break;

    case ZE_STRUCTURE_TYPE_COMMAND_LIST_DESC:
        str = "COMMAND_LIST_DESC";
        break;

    case ZE_STRUCTURE_TYPE_EVENT_POOL_DESC:
        str = "EVENT_POOL_DESC";
        break;

    case ZE_STRUCTURE_TYPE_EVENT_DESC:
        str = "EVENT_DESC";
        break;

    case ZE_STRUCTURE_TYPE_FENCE_DESC:
        str = "FENCE_DESC";
        break;

    case ZE_STRUCTURE_TYPE_IMAGE_DESC:
        str = "IMAGE_DESC";
        break;

    case ZE_STRUCTURE_TYPE_IMAGE_PROPERTIES:
        str = "IMAGE_PROPERTIES";
        break;

    case ZE_STRUCTURE_TYPE_DEVICE_MEM_ALLOC_DESC:
        str = "DEVICE_MEM_ALLOC_DESC";
        break;

    default:
        str = "?";
        break;
    };

    return str;
}